

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int myrand(void *rng_state,uchar *output,size_t len)

{
  int iVar1;
  ulong local_28;
  size_t i;
  size_t len_local;
  uchar *output_local;
  void *rng_state_local;
  
  for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
    iVar1 = rand();
    output[local_28] = (uchar)iVar1;
  }
  return 0;
}

Assistant:

static int myrand( void *rng_state, unsigned char *output, size_t len )
{
#if !defined(__OpenBSD__)
    size_t i;

    if( rng_state != NULL )
        rng_state  = NULL;

    for( i = 0; i < len; ++i )
        output[i] = rand();
#else
    if( rng_state != NULL )
        rng_state = NULL;

    arc4random_buf( output, len );
#endif /* !OpenBSD */

    return( 0 );
}